

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O1

StateVector * __thiscall
testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::Matrix<double,4,1,0,4,1>const&,Eigen
::Matrix<double,1,1,0,1,1>_const__unsigned_int_
          (StateVector *__return_storage_ptr__,void *this,StateVector *xk,InputVector *u,uint k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  dVar20 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
           [0];
  dVar1 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar3 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  dVar19 = cos((dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2 + dVar20 * dVar20) * 10.0);
  dVar20 = (u->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array
           [0];
  dVar3 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar4 = *(double *)((long)this + 0x88);
  dVar5 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar6 = *(double *)((long)this + 0xa8);
  dVar7 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar8 = *(double *)((long)this + 200);
  dVar1 = (xk->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  dVar9 = *(double *)((long)this + 0xe8);
  dVar10 = *(double *)((long)this + 0x90);
  dVar11 = *(double *)((long)this + 0x98);
  dVar20 = dVar20 * dVar20;
  dVar12 = *(double *)((long)this + 0xb0);
  dVar13 = *(double *)((long)this + 0xb8);
  dVar14 = *(double *)((long)this + 0xd0);
  dVar15 = *(double *)((long)this + 0xd8);
  dVar16 = *(double *)((long)this + 0xf0);
  dVar17 = *(double *)((long)this + 0xf8);
  dVar18 = *(double *)((long)this + 0x18);
  dVar2 = *(double *)((long)this + 0x38);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[0] =
       *(double *)((long)this + 0x10) * dVar20 +
       dVar19 * *(double *)((long)this + 0x10) +
       *(double *)((long)this + 0xe0) * dVar1 +
       *(double *)((long)this + 0xc0) * dVar7 +
       *(double *)((long)this + 0xa0) * dVar5 + *(double *)((long)this + 0x80) * dVar3 +
       *(double *)((long)this + 0x30);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[1] =
       dVar18 * dVar20 +
       dVar19 * dVar18 + dVar9 * dVar1 + dVar8 * dVar7 + dVar6 * dVar5 + dVar4 * dVar3 + dVar2;
  dVar4 = *(double *)((long)this + 0x28);
  dVar2 = *(double *)((long)this + 0x48);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[2] =
       dVar20 * *(double *)((long)this + 0x20) +
       dVar19 * *(double *)((long)this + 0x20) +
       dVar1 * dVar16 + dVar7 * dVar14 + dVar5 * dVar12 + dVar3 * dVar10 +
       *(double *)((long)this + 0x40);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.
  m_data.array[3] =
       dVar20 * dVar4 +
       dVar19 * dVar4 + dVar1 * dVar17 + dVar7 * dVar15 + dVar5 * dVar13 + dVar3 * dVar11 + dVar2;
  return __return_storage_ptr__;
}

Assistant:

virtual ekf::StateVector stateDynamics(const ekf::StateVector& xk, const ekf::InputVector& u, unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::StateVector xk1;
            xk1=a_*xk+cos(10*(xk.transpose()*xk)[0])*s_+t_+(u*u.transpose())[0]*s_;
            return xk1;
        }